

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDitheringTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles3::Functional::DitheringCase::drawAndCheckUnicoloredQuad
          (DitheringCase *this,Vec4 *quadColor)

{
  RenderContext *context;
  RGBA RVar1;
  undefined8 uVar2;
  bool bVar3;
  deUint32 seed;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  GLenum GVar8;
  deBool dVar9;
  char *pcVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  MessageBuilder *pMVar11;
  MessageBuilder local_9d0;
  RGBA local_850;
  int local_84c;
  RGBA curClr;
  int x_1;
  int y_1;
  RGBA renderedClr00;
  string local_838;
  allocator<char> local_811;
  string local_810;
  LogImage local_7f0;
  deUint32 local_75c;
  MessageBuilder local_758;
  deUint32 local_5d4;
  RGBA local_5d0;
  int local_5cc;
  int local_5c8;
  int x;
  int y;
  bool colorChoicesOk;
  Surface errorMask;
  string local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  string local_560;
  allocator<char> local_539;
  string local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  string local_4f8;
  LogImage local_4d8;
  PixelBufferAccess local_448;
  MessageBuilder local_420;
  char *local_2a0;
  MessageBuilder local_298;
  undefined1 local_118 [8];
  Surface renderedImg;
  Quad quad;
  int viewportY;
  int viewportX;
  int viewportHei;
  int viewportWid;
  int maxViewportHei;
  int maxViewportWid;
  Random rnd;
  TestLog *log;
  Vec4 *quadColor_local;
  DitheringCase *this_local;
  
  rnd.m_rnd._8_8_ = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  pcVar10 = tcu::TestNode::getName((TestNode *)this);
  seed = deStringHash(pcVar10);
  de::Random::Random((Random *)&maxViewportHei,seed);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar4 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar4));
  iVar4 = de::min<int>(iVar4,0x20);
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar5 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_00,iVar5));
  iVar5 = de::min<int>(iVar5,0x20);
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar6 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var_01,iVar6));
  iVar6 = de::Random::getInt((Random *)&maxViewportHei,0,iVar6 - iVar4);
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar7 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_02,iVar7));
  iVar7 = de::Random::getInt((Random *)&maxViewportHei,0,iVar7 - iVar5);
  deqp::gls::FragmentOpUtil::Quad::Quad((Quad *)&renderedImg.m_pixels.m_cap);
  tcu::Surface::Surface((Surface *)local_118,iVar4,iVar5);
  do {
    glwViewport(iVar6,iVar7,iVar4,iVar5);
    GVar8 = glwGetError();
    glu::checkError(GVar8,"glViewport(viewportX, viewportY, viewportWid, viewportHei)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDitheringTests.cpp"
                    ,0x170);
    dVar9 = ::deGetFalse();
  } while (dVar9 != 0);
  tcu::TestLog::operator<<
            (&local_298,(TestLog *)rnd.m_rnd._8_8_,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar11 = tcu::MessageBuilder::operator<<(&local_298,(char (*) [14])"Dithering is ");
  local_2a0 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
  if ((this->m_ditheringEnabled & 1U) != 0) {
    local_2a0 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
  }
  local_2a0 = local_2a0 + 0x27;
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_2a0);
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_298);
  if ((this->m_ditheringEnabled & 1U) == 0) {
    do {
      glwDisable(0xbd0);
      GVar8 = glwGetError();
      glu::checkError(GVar8,"glDisable(GL_DITHER)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDitheringTests.cpp"
                      ,0x177);
      dVar9 = ::deGetFalse();
    } while (dVar9 != 0);
  }
  else {
    do {
      glwEnable(0xbd0);
      GVar8 = glwGetError();
      glu::checkError(GVar8,"glEnable(GL_DITHER)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDitheringTests.cpp"
                      ,0x175);
      dVar9 = ::deGetFalse();
    } while (dVar9 != 0);
  }
  tcu::TestLog::operator<<
            (&local_420,(TestLog *)rnd.m_rnd._8_8_,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar11 = tcu::MessageBuilder::operator<<
                      (&local_420,(char (*) [39])"Drawing an unicolored quad with color ");
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,quadColor);
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_420);
  deqp::gls::FragmentOpUtil::QuadRenderer::render
            (this->m_renderer,(Quad *)&renderedImg.m_pixels.m_cap);
  context = this->m_renderCtx;
  tcu::Surface::getAccess(&local_448,(Surface *)local_118);
  glu::readPixels(context,iVar6,iVar7,&local_448);
  GVar8 = glwGetError();
  glu::checkError(GVar8,"glReadPixels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDitheringTests.cpp"
                  ,0x183);
  uVar2 = rnd.m_rnd._8_8_;
  de::toString<int>(&local_538,&this->m_iteration);
  std::operator+(&local_518,"Quad",&local_538);
  pcVar10 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,pcVar10,&local_539);
  de::toString<int>(&local_5a0,&this->m_iteration);
  std::operator+(&local_580,"Quad ",&local_5a0);
  pcVar10 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,pcVar10,(allocator<char> *)((long)&errorMask.m_pixels.m_cap + 7));
  tcu::LogImage::LogImage
            (&local_4d8,&local_4f8,&local_560,(Surface *)local_118,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<((TestLog *)uVar2,&local_4d8);
  tcu::LogImage::~LogImage(&local_4d8);
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator((allocator<char> *)((long)&errorMask.m_pixels.m_cap + 7));
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator(&local_539);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_538);
  tcu::Surface::Surface((Surface *)&y,iVar4,iVar5);
  x._3_1_ = 1;
  for (local_5c8 = 0; iVar4 = local_5c8, iVar5 = tcu::Surface::getHeight((Surface *)local_118),
      uVar2 = rnd.m_rnd._8_8_, iVar4 < iVar5; local_5c8 = local_5c8 + 1) {
    for (local_5cc = 0; iVar4 = local_5cc, iVar5 = tcu::Surface::getWidth((Surface *)local_118),
        iVar4 < iVar5; local_5cc = local_5cc + 1) {
      local_5d0 = tcu::Surface::getPixel((Surface *)local_118,local_5cc,local_5c8);
      bVar3 = checkColor(this,quadColor,&local_5d0,(bool)(x._3_1_ & 1));
      iVar5 = local_5c8;
      iVar4 = local_5cc;
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        local_75c = (deUint32)tcu::RGBA::green();
        tcu::Surface::setPixel((Surface *)&y,iVar4,iVar5,(RGBA)local_75c);
      }
      else {
        local_5d4 = (deUint32)tcu::RGBA::red();
        tcu::Surface::setPixel((Surface *)&y,iVar4,iVar5,(RGBA)local_5d4);
        if ((x._3_1_ & 1) != 0) {
          tcu::TestLog::operator<<
                    (&local_758,(TestLog *)rnd.m_rnd._8_8_,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar11 = tcu::MessageBuilder::operator<<
                              (&local_758,(char (*) [25])"First failure at pixel (");
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_5cc);
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x12ed2ef);
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_5c8);
          pMVar11 = tcu::MessageBuilder::operator<<
                              (pMVar11,(char (*) [32])") (not printing further errors)");
          tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_758);
          x._3_1_ = 0;
        }
      }
    }
  }
  bVar3 = (x._3_1_ & 1) == 0;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_810,"ColorChoiceErrorMask",&local_811);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_838,"Error mask for color choices",
               (allocator<char> *)((long)&renderedClr00.m_value + 3));
    tcu::LogImage::LogImage
              (&local_7f0,&local_810,&local_838,(Surface *)&y,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<((TestLog *)uVar2,&local_7f0);
    tcu::LogImage::~LogImage(&local_7f0);
    std::__cxx11::string::~string((string *)&local_838);
    std::allocator<char>::~allocator((allocator<char> *)((long)&renderedClr00.m_value + 3));
    std::__cxx11::string::~string((string *)&local_810);
    std::allocator<char>::~allocator(&local_811);
    this_local._7_1_ = 0;
  }
  y_1 = (int)bVar3;
  tcu::Surface::~Surface((Surface *)&y);
  if (y_1 == 0) {
    if ((this->m_ditheringEnabled & 1U) == 0) {
      x_1 = (int)tcu::Surface::getPixel((Surface *)local_118,0,0);
      for (curClr.m_value = 0; RVar1.m_value = curClr.m_value,
          iVar4 = tcu::Surface::getHeight((Surface *)local_118), (int)RVar1.m_value < iVar4;
          curClr.m_value = curClr.m_value + 1) {
        for (local_84c = 0; iVar4 = local_84c, iVar5 = tcu::Surface::getWidth((Surface *)local_118),
            iVar4 < iVar5; local_84c = local_84c + 1) {
          local_850 = tcu::Surface::getPixel((Surface *)local_118,local_84c,curClr.m_value);
          bVar3 = tcu::RGBA::operator!=(&local_850,(RGBA *)&x_1);
          if (bVar3) {
            tcu::TestLog::operator<<
                      (&local_9d0,(TestLog *)rnd.m_rnd._8_8_,
                       (BeginMessageToken *)&tcu::TestLog::Message);
            pMVar11 = tcu::MessageBuilder::operator<<
                                (&local_9d0,(char (*) [20])"Failure: color at (");
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_84c);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x12ed2ef);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(int *)&curClr);
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [6])") is ");
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_850);
            pMVar11 = tcu::MessageBuilder::operator<<
                                (pMVar11,(char (*) [51])
                                         " and does not equal the color at (0, 0), which is ");
            pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(RGBA *)&x_1);
            tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_9d0);
            this_local._7_1_ = 0;
            y_1 = 1;
            goto LAB_00a78429;
          }
        }
      }
    }
    this_local._7_1_ = 1;
    y_1 = 1;
  }
LAB_00a78429:
  tcu::Surface::~Surface((Surface *)local_118);
  de::Random::~Random((Random *)&maxViewportHei);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool DitheringCase::drawAndCheckUnicoloredQuad (const Vec4& quadColor) const
{
	TestLog&					log					= m_testCtx.getLog();
	Random						rnd					(deStringHash(getName()));
	const int					maxViewportWid		= 32;
	const int					maxViewportHei		= 32;
	const int					viewportWid			= de::min(m_renderCtx.getRenderTarget().getWidth(), maxViewportWid);
	const int					viewportHei			= de::min(m_renderCtx.getRenderTarget().getHeight(), maxViewportHei);
	const int					viewportX			= rnd.getInt(0, m_renderCtx.getRenderTarget().getWidth() - viewportWid);
	const int					viewportY			= rnd.getInt(0, m_renderCtx.getRenderTarget().getHeight() - viewportHei);
	Quad						quad;
	Surface						renderedImg			(viewportWid, viewportHei);

	GLU_CHECK_CALL(glViewport(viewportX, viewportY, viewportWid, viewportHei));

	log << TestLog::Message << "Dithering is " << (m_ditheringEnabled ? "enabled" : "disabled") << TestLog::EndMessage;

	if (m_ditheringEnabled)
		GLU_CHECK_CALL(glEnable(GL_DITHER));
	else
		GLU_CHECK_CALL(glDisable(GL_DITHER));

	log << TestLog::Message << "Drawing an unicolored quad with color " << quadColor << TestLog::EndMessage;

	quad.color[0] = quadColor;
	quad.color[1] = quadColor;
	quad.color[2] = quadColor;
	quad.color[3] = quadColor;

	m_renderer->render(quad);

	glu::readPixels(m_renderCtx, viewportX, viewportY, renderedImg.getAccess());
	GLU_CHECK_MSG("glReadPixels()");

	log << TestLog::Image(("Quad" + de::toString(m_iteration)).c_str(), ("Quad " + de::toString(m_iteration)).c_str(), renderedImg);

	// Validate, at each pixel, that each color channel is one of its two allowed values.

	{
		Surface		errorMask		(viewportWid, viewportHei);
		bool		colorChoicesOk	= true;

		for (int y = 0; y < renderedImg.getHeight(); y++)
		{
			for (int x = 0; x < renderedImg.getWidth(); x++)
			{
				if (!checkColor(quadColor, renderedImg.getPixel(x, y), colorChoicesOk))
				{
					errorMask.setPixel(x, y, tcu::RGBA::red());

					if (colorChoicesOk)
					{
						log << TestLog::Message << "First failure at pixel (" << x << ", " << y << ") (not printing further errors)" << TestLog::EndMessage;
						colorChoicesOk = false;
					}
				}
				else
					errorMask.setPixel(x, y, tcu::RGBA::green());
			}
		}

		if (!colorChoicesOk)
		{
			log << TestLog::Image("ColorChoiceErrorMask", "Error mask for color choices", errorMask);
			return false;
		}
	}

	// When dithering is disabled, the color selection must be coordinate-independent - i.e. the entire rendered image must be unicolored.

	if (!m_ditheringEnabled)
	{
		const tcu::RGBA renderedClr00 = renderedImg.getPixel(0, 0);

		for (int y = 0; y < renderedImg.getHeight(); y++)
		{
			for (int x = 0; x < renderedImg.getWidth(); x++)
			{
				const tcu::RGBA curClr = renderedImg.getPixel(x, y);

				if (curClr != renderedClr00)
				{
					log << TestLog::Message
						<< "Failure: color at (" << x << ", " << y << ") is " << curClr
						<< " and does not equal the color at (0, 0), which is " << renderedClr00
						<< TestLog::EndMessage;

					return false;
				}
			}
		}
	}

	return true;
}